

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Model.pb.cc
# Opt level: O2

void CoreML::Specification::protobuf_Model_2eproto::AddDescriptorsImpl(void)

{
  _func_void *in_stack_00000008;
  
  InitDefaults();
  CoreMLModels::protobuf_VisionFeaturePrint_2eproto::AddDescriptors();
  CoreMLModels::protobuf_AudioFeaturePrint_2eproto::AddDescriptors();
  CoreMLModels::protobuf_TextClassifier_2eproto::AddDescriptors();
  CoreMLModels::protobuf_WordTagger_2eproto::AddDescriptors();
  CoreMLModels::protobuf_Gazetteer_2eproto::AddDescriptors();
  CoreMLModels::protobuf_WordEmbedding_2eproto::AddDescriptors();
  protobuf_ArrayFeatureExtractor_2eproto::AddDescriptors();
  protobuf_BayesianProbitRegressor_2eproto::AddDescriptors();
  protobuf_CategoricalMapping_2eproto::AddDescriptors();
  protobuf_CustomModel_2eproto::AddDescriptors();
  protobuf_DictVectorizer_2eproto::AddDescriptors();
  protobuf_FeatureTypes_2eproto::AddDescriptors();
  protobuf_FeatureVectorizer_2eproto::AddDescriptors();
  protobuf_GLMRegressor_2eproto::AddDescriptors();
  protobuf_GLMClassifier_2eproto::AddDescriptors();
  protobuf_NearestNeighbors_2eproto::AddDescriptors();
  protobuf_Identity_2eproto::AddDescriptors();
  protobuf_Imputer_2eproto::AddDescriptors();
  MILSpec::protobuf_MIL_2eproto::AddDescriptors();
  protobuf_NeuralNetwork_2eproto::AddDescriptors();
  protobuf_Normalizer_2eproto::AddDescriptors();
  protobuf_OneHotEncoder_2eproto::AddDescriptors();
  protobuf_Scaler_2eproto::AddDescriptors();
  protobuf_NonMaximumSuppression_2eproto::AddDescriptors();
  protobuf_SVM_2eproto::AddDescriptors();
  protobuf_TreeEnsemble_2eproto::AddDescriptors();
  protobuf_Parameters_2eproto::AddDescriptors();
  protobuf_ItemSimilarityRecommender_2eproto::AddDescriptors();
  CoreMLModels::protobuf_SoundAnalysisPreprocessing_2eproto::AddDescriptors();
  protobuf_LinkedModel_2eproto::AddDescriptors();
  google::protobuf::internal::OnShutdown(in_stack_00000008);
  return;
}

Assistant:

void AddDescriptorsImpl() {
  InitDefaults();
  ::CoreML::Specification::CoreMLModels::protobuf_VisionFeaturePrint_2eproto::AddDescriptors();
  ::CoreML::Specification::CoreMLModels::protobuf_AudioFeaturePrint_2eproto::AddDescriptors();
  ::CoreML::Specification::CoreMLModels::protobuf_TextClassifier_2eproto::AddDescriptors();
  ::CoreML::Specification::CoreMLModels::protobuf_WordTagger_2eproto::AddDescriptors();
  ::CoreML::Specification::CoreMLModels::protobuf_Gazetteer_2eproto::AddDescriptors();
  ::CoreML::Specification::CoreMLModels::protobuf_WordEmbedding_2eproto::AddDescriptors();
  ::CoreML::Specification::protobuf_ArrayFeatureExtractor_2eproto::AddDescriptors();
  ::CoreML::Specification::protobuf_BayesianProbitRegressor_2eproto::AddDescriptors();
  ::CoreML::Specification::protobuf_CategoricalMapping_2eproto::AddDescriptors();
  ::CoreML::Specification::protobuf_CustomModel_2eproto::AddDescriptors();
  ::CoreML::Specification::protobuf_DictVectorizer_2eproto::AddDescriptors();
  ::CoreML::Specification::protobuf_FeatureTypes_2eproto::AddDescriptors();
  ::CoreML::Specification::protobuf_FeatureVectorizer_2eproto::AddDescriptors();
  ::CoreML::Specification::protobuf_GLMRegressor_2eproto::AddDescriptors();
  ::CoreML::Specification::protobuf_GLMClassifier_2eproto::AddDescriptors();
  ::CoreML::Specification::protobuf_NearestNeighbors_2eproto::AddDescriptors();
  ::CoreML::Specification::protobuf_Identity_2eproto::AddDescriptors();
  ::CoreML::Specification::protobuf_Imputer_2eproto::AddDescriptors();
  ::CoreML::Specification::MILSpec::protobuf_MIL_2eproto::AddDescriptors();
  ::CoreML::Specification::protobuf_NeuralNetwork_2eproto::AddDescriptors();
  ::CoreML::Specification::protobuf_Normalizer_2eproto::AddDescriptors();
  ::CoreML::Specification::protobuf_OneHotEncoder_2eproto::AddDescriptors();
  ::CoreML::Specification::protobuf_Scaler_2eproto::AddDescriptors();
  ::CoreML::Specification::protobuf_NonMaximumSuppression_2eproto::AddDescriptors();
  ::CoreML::Specification::protobuf_SVM_2eproto::AddDescriptors();
  ::CoreML::Specification::protobuf_TreeEnsemble_2eproto::AddDescriptors();
  ::CoreML::Specification::protobuf_Parameters_2eproto::AddDescriptors();
  ::CoreML::Specification::protobuf_ItemSimilarityRecommender_2eproto::AddDescriptors();
  ::CoreML::Specification::CoreMLModels::protobuf_SoundAnalysisPreprocessing_2eproto::AddDescriptors();
  ::CoreML::Specification::protobuf_LinkedModel_2eproto::AddDescriptors();
  ::google::protobuf::internal::OnShutdown(&TableStruct::Shutdown);
}